

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::WeightParams::SerializeWithCachedSizes
          (WeightParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  uint value;
  float *a;
  
  if (0 < (this->floatvalue_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
      iVar5 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      iVar5 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar5;
    }
    value = this->_floatvalue_cached_byte_size_;
    if (iVar5 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar6 = pbVar1;
      uVar7 = value;
      if (0x7f < value) {
        do {
          *pbVar6 = (byte)value | 0x80;
          uVar7 = value >> 7;
          pbVar6 = pbVar6 + 1;
          bVar4 = 0x3fff < value;
          value = uVar7;
        } while (bVar4);
      }
      *pbVar6 = (byte)uVar7;
      iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
    pRVar2 = (this->floatvalue_).rep_;
    a = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      a = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (a,(this->floatvalue_).current_size_,output);
  }
  psVar3 = (this->float16value_).ptr_;
  if (psVar3->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(2,psVar3,output);
  }
  psVar3 = (this->rawvalue_).ptr_;
  if (psVar3->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(0x1e,psVar3,output);
  }
  psVar3 = (this->int8rawvalue_).ptr_;
  if (psVar3->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(0x1f,psVar3,output);
  }
  if (this->quantization_ != (QuantizationParams *)0x0 &&
      this != (WeightParams *)&_WeightParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x28,&this->quantization_->super_MessageLite,output);
  }
  if (this->isupdatable_ != true) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteBool(0x32,true,output);
  return;
}

Assistant:

void WeightParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.WeightParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  if (this->floatvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_floatvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->floatvalue().data(), this->floatvalue_size(), output);
  }

  // bytes float16Value = 2;
  if (this->float16value().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      2, this->float16value(), output);
  }

  // bytes rawValue = 30;
  if (this->rawvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      30, this->rawvalue(), output);
  }

  // bytes int8RawValue = 31;
  if (this->int8rawvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      31, this->int8rawvalue(), output);
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->has_quantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      40, *this->quantization_, output);
  }

  // bool isUpdatable = 50;
  if (this->isupdatable() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->isupdatable(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.WeightParams)
}